

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::SignMessage
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aSignature,Message *aMessage)

{
  ErrorCode EVar1;
  Error *pEVar2;
  undefined1 local_c0 [40];
  Sign1Message sign1Msg;
  ByteArray keyId;
  ByteArray externalData;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cose::Sign1Message::Sign1Message(&sign1Msg);
  keyId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keyId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keyId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PrepareSigningContent((Error *)local_c0,&externalData,aMessage);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_c0 + 8));
  if (EVar1 == kNone) {
    cose::Sign1Message::Init((Error *)local_c0,&sign1Msg,0);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_c0 + 8));
    if (EVar1 == kNone) {
      cose::Sign1Message::AddAttribute((Error *)local_c0,&sign1Msg,1,-7,1);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string((string *)(local_c0 + 8));
      if (EVar1 == kNone) {
        GetKeyId((Error *)local_c0,this,&keyId);
        pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
        EVar1 = pEVar2->mCode;
        std::__cxx11::string::~string((string *)(local_c0 + 8));
        if (EVar1 == kNone) {
          cose::Sign1Message::AddAttribute((Error *)local_c0,&sign1Msg,4,&keyId,2);
          pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
          EVar1 = pEVar2->mCode;
          std::__cxx11::string::~string((string *)(local_c0 + 8));
          if (EVar1 == kNone) {
            local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cose::Sign1Message::SetContent((Error *)local_c0,&sign1Msg,(ByteArray *)&local_48);
            pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
            EVar1 = pEVar2->mCode;
            std::__cxx11::string::~string((string *)(local_c0 + 8));
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_48);
            if (EVar1 == kNone) {
              cose::Sign1Message::SetExternalData((Error *)local_c0,&sign1Msg,&externalData);
              pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
              EVar1 = pEVar2->mCode;
              std::__cxx11::string::~string((string *)(local_c0 + 8));
              if (EVar1 == kNone) {
                cose::Sign1Message::Sign
                          ((Error *)local_c0,&sign1Msg,(mbedtls_pk_context *)&this->mPrivateKey);
                pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
                EVar1 = pEVar2->mCode;
                std::__cxx11::string::~string((string *)(local_c0 + 8));
                if (EVar1 == kNone) {
                  cose::Sign1Message::Serialize((Error *)local_c0,&sign1Msg,aSignature);
                  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
                  EVar1 = pEVar2->mCode;
                  std::__cxx11::string::~string((string *)(local_c0 + 8));
                  if (EVar1 == kNone) {
                    this->mSequenceNumber = this->mSequenceNumber + 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  cose::Sign1Message::Free(&sign1Msg);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&keyId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::SignMessage(ByteArray &aSignature, const coap::Message &aMessage)
{
    Error              error;
    ByteArray          externalData;
    cose::Sign1Message sign1Msg;
    ByteArray          keyId;

    SuccessOrExit(error = PrepareSigningContent(externalData, aMessage));

    SuccessOrExit(error = sign1Msg.Init(cose::kInitFlagsNone));
    SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderAlgorithm, cose::kAlgEcdsaWithSha256, cose::kProtectOnly));
#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
    // In case of getting Key ID failed, Use all-zero value by default.
    keyId.resize(kMaxCoseKeyIdLength);
    std::fill(keyId.begin(), keyId.end(), 0);
    IgnoreError(GetKeyId(keyId));
#else
    SuccessOrExit(error = GetKeyId(keyId));
#endif
    SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderKeyId, keyId, cose::kUnprotectOnly));

    // TODO(wgtdkp): set cose::kHeaderIV to mSequenceNumber.
    // SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderIV, , cose::kProtectOnly));
    SuccessOrExit(error = sign1Msg.SetContent({}));

    // The serialized message as external data for COSE signing.
    SuccessOrExit(error = sign1Msg.SetExternalData(externalData));

    SuccessOrExit(error = sign1Msg.Sign(mPrivateKey));
    SuccessOrExit(error = sign1Msg.Serialize(aSignature));

    // TODO(wgtdkp): synchronize to persist store.
    ++mSequenceNumber;

exit:
    sign1Msg.Free();
    return error;
}